

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

_Bool unix_add_keyfile(char *filename_str,_Bool add_encrypted)

{
  char *prompt_00;
  char *passphrase_00;
  size_t n;
  char *passphrase;
  char *prompt;
  char *err;
  _Bool ret;
  Filename *pFStack_20;
  int status;
  Filename *filename;
  char *pcStack_10;
  _Bool add_encrypted_local;
  char *filename_str_local;
  
  filename._7_1_ = add_encrypted;
  pcStack_10 = filename_str;
  pFStack_20 = filename_from_str(filename_str);
  err._3_1_ = 1;
  err._4_4_ = pageant_add_keyfile(pFStack_20,(char *)0x0,&prompt,(_Bool)(filename._7_1_ & 1));
  if (err._4_4_ != 0) {
    if (err._4_4_ == 1) {
      fprintf(_stderr,"pageant: %s: %s\n",pcStack_10,prompt);
      err._3_1_ = 0;
    }
    else {
      do {
        prompt_00 = dupprintf("Enter passphrase to load key \'%s\'",prompt);
        passphrase_00 = askpass(prompt_00);
        safefree(prompt);
        safefree(prompt_00);
        prompt = (char *)0x0;
        if (passphrase_00 == (char *)0x0) goto LAB_0010ad8f;
        err._4_4_ = pageant_add_keyfile(pFStack_20,passphrase_00,&prompt,(_Bool)(filename._7_1_ & 1)
                                       );
        n = strlen(passphrase_00);
        smemclr(passphrase_00,n);
        safefree(passphrase_00);
        if (err._4_4_ == 0) goto LAB_0010ad8f;
      } while (err._4_4_ != 1);
      fprintf(_stderr,"pageant: %s: %s\n",pcStack_10,prompt);
      err._3_1_ = 0;
    }
  }
LAB_0010ad8f:
  safefree(prompt);
  filename_free(pFStack_20);
  return (_Bool)(err._3_1_ & 1);
}

Assistant:

static bool unix_add_keyfile(const char *filename_str, bool add_encrypted)
{
    Filename *filename = filename_from_str(filename_str);
    int status;
    bool ret;
    char *err;

    ret = true;

    /*
     * Try without a passphrase.
     */
    status = pageant_add_keyfile(filename, NULL, &err, add_encrypted);
    if (status == PAGEANT_ACTION_OK) {
        goto cleanup;
    } else if (status == PAGEANT_ACTION_FAILURE) {
        fprintf(stderr, "pageant: %s: %s\n", filename_str, err);
        ret = false;
        goto cleanup;
    }

    /*
     * And now try prompting for a passphrase.
     */
    while (1) {
        char *prompt = dupprintf(
            "Enter passphrase to load key '%s'", err);
        char *passphrase = askpass(prompt);
        sfree(err);
        sfree(prompt);
        err = NULL;
        if (!passphrase)
            break;

        status = pageant_add_keyfile(filename, passphrase, &err,
                                     add_encrypted);

        smemclr(passphrase, strlen(passphrase));
        sfree(passphrase);
        passphrase = NULL;

        if (status == PAGEANT_ACTION_OK) {
            goto cleanup;
        } else if (status == PAGEANT_ACTION_FAILURE) {
            fprintf(stderr, "pageant: %s: %s\n", filename_str, err);
            ret = false;
            goto cleanup;
        }
    }

  cleanup:
    sfree(err);
    filename_free(filename);
    return ret;
}